

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.h
# Opt level: O3

any * __thiscall
dap::any::operator=(any *this,
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>_>
                   *val)

{
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,dap::any>,std::allocator<std::pair<std::__cxx11::string_const,dap::any>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *this_00;
  int iVar1;
  int iVar2;
  uintptr_t addr;
  TypeInfo *pTVar3;
  TypeInfo *pTVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *pvVar6;
  uintptr_t ptr;
  uint8_t *puVar7;
  ulong uVar8;
  ulong uVar5;
  
  pTVar4 = this->type;
  pTVar3 = TypeOf<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>_>_>
           ::type();
  this_00 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,dap::any>,std::allocator<std::pair<std::__cxx11::string_const,dap::any>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
             *)this->value;
  if (pTVar4 == pTVar3) {
    if (this_00 !=
        (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,dap::any>,std::allocator<std::pair<std::__cxx11::string_const,dap::any>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
         *)val) {
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,dap::any>,std::allocator<std::pair<std::__cxx11::string_const,dap::any>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,dap::any>,std::allocator<std::pair<std::__cxx11::string_const,dap::any>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                (this_00,&val->_M_h);
    }
  }
  else {
    if (this_00 !=
        (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,dap::any>,std::allocator<std::pair<std::__cxx11::string_const,dap::any>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
         *)0x0) {
      (*this->type->_vptr_TypeInfo[7])();
      if (this->value == (void *)0x0) {
        __assert_fail("value != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/any.h"
                      ,0xc3,"void dap::any::free()");
      }
      if (this->heap != (void *)0x0) {
        operator_delete__(this->heap);
        this->heap = (void *)0x0;
      }
    }
    this->value = (void *)0x0;
    this->type = (TypeInfo *)0x0;
    pTVar4 = TypeOf<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>_>_>
             ::type();
    this->type = pTVar4;
    iVar1 = (*pTVar4->_vptr_TypeInfo[3])(pTVar4);
    iVar2 = (*this->type->_vptr_TypeInfo[4])();
    uVar5 = CONCAT44(extraout_var_00,iVar2);
    if (this->value != (void *)0x0) {
      __assert_fail("value == nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/any.h"
                    ,0xb9,"void dap::any::alloc(size_t, size_t)");
    }
    puVar7 = this->buffer + (uVar5 - 1) + -((ulong)(this->buffer + (uVar5 - 1)) % uVar5);
    this->value = puVar7;
    if ((any *)(puVar7 + CONCAT44(extraout_var,iVar1) + -1) < this->buffer ||
        this + 1 <= (any *)(puVar7 + CONCAT44(extraout_var,iVar1) + -1)) {
      pvVar6 = operator_new__(CONCAT44(extraout_var,iVar1) + uVar5);
      this->heap = pvVar6;
      uVar8 = (uVar5 - 1) + (long)pvVar6;
      puVar7 = (uint8_t *)(uVar8 - uVar8 % uVar5);
      this->value = puVar7;
    }
    (*this->type->_vptr_TypeInfo[6])(this->type,puVar7,val);
  }
  return this;
}

Assistant:

any& any::operator=(const T& val) {
  if (!is<T>()) {
    reset();
    type = TypeOf<T>::type();
    alloc(type->size(), type->alignment());
    type->copyConstruct(value, &val);
  } else {
#ifdef __clang_analyzer__
    assert(value != nullptr);
#endif
    *reinterpret_cast<T*>(value) = val;
  }
  return *this;
}